

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::piece_picker::dec_refcount
          (piece_picker *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask,torrent_peer *peer)

{
  prio_index_t elem_index;
  pointer ppVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar7;
  ulong uVar8;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar9;
  _Head_base<0UL,_unsigned_int_*,_false> peer_00;
  uint uVar10;
  ulong uVar11;
  uint32_t *puVar12;
  int iVar13;
  long lVar14;
  piece_pos *this_00;
  const_iterator cVar15;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> asStack_58 [2];
  undefined1 local_50 [8];
  alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  decremented_destructor;
  
  psVar9 = asStack_58;
  bVar2 = bitfield::none_set(&bitmask->super_bitfield);
  if (bVar2) {
    return;
  }
  bVar2 = bitfield::all_set(&bitmask->super_bitfield);
  peer_00._M_head_impl =
       *(uint **)&(bitmask->super_bitfield).m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if (bVar2) {
    if ((_Head_base<0UL,_unsigned_int_*,_false>)peer_00._M_head_impl ==
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *peer_00._M_head_impl;
    }
    if (uVar10 == (uint)((ulong)((long)(this->m_piece_map).
                                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                       .
                                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_piece_map).
                                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      .
                                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      dec_refcount_all(this,(torrent_peer *)peer_00._M_head_impl);
      return;
    }
  }
  if ((torrent_peer *)peer_00._M_head_impl == (torrent_peer *)0x0) {
    iVar4 = 0;
LAB_0025f5b9:
    decremented_destructor.objects.m_ptr =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
    psVar7 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
  }
  else {
    uVar8 = (long)(int)*peer_00._M_head_impl / 2;
    uVar11 = 0x32;
    if ((int)uVar8 < 0x32) {
      uVar11 = uVar8;
    }
    decremented_destructor.objects.m_ptr =
         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)(uVar11 & 0xffffffff);
    iVar4 = (int)uVar11;
    if ((int)*peer_00._M_head_impl < 2) goto LAB_0025f5b9;
    psVar7 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
             ((long)asStack_58 - (ulong)(iVar4 * 4 + 0xfU & 0xfffffff0));
    psVar9 = psVar7;
  }
  local_50 = (undefined1  [8])psVar7;
  if (this->m_dirty == false) {
    puVar12 = peer_00._M_head_impl + 1;
    if ((torrent_peer *)peer_00._M_head_impl == (torrent_peer *)0x0) {
      puVar12 = (uint32_t *)0x0;
    }
    *(undefined8 *)(psVar9 + -2) = 0x25f5ec;
    cVar15 = bitfield::end(&bitmask->super_bitfield);
    iVar6 = 0;
    uVar10 = 0x80000000;
    uVar8 = 0;
    while (uVar10 != cVar15.bit || puVar12 != cVar15.buf) {
      if ((*puVar12 &
          (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)) !=
          0) {
        iVar13 = (int)uVar8;
        if (iVar13 < iVar4) {
          psVar7[iVar13].m_val = iVar6;
        }
        uVar8 = (ulong)(iVar13 + 1U);
        if (iVar4 <= (int)(iVar13 + 1U)) break;
      }
      bVar2 = uVar10 == 1;
      puVar12 = puVar12 + bVar2;
      uVar10 = uVar10 >> 1;
      if (bVar2) {
        uVar10 = 0x80000000;
      }
      iVar6 = iVar6 + 1;
    }
    if ((int)uVar8 < iVar4) {
      uVar11 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
        this_00 = (this->m_piece_map).
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  .
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start + psVar7[uVar11].m_val;
        *(undefined8 *)(psVar9 + -2) = 0x25f682;
        iVar4 = piece_pos::priority(this_00,this);
        uVar10 = *(uint *)this_00;
        if ((uVar10 & 0x3ffffff) == 0) {
          *(undefined8 *)(psVar9 + -2) = 0x25f697;
          break_one_seed(this);
          uVar10 = *(uint *)this_00;
        }
        *(uint *)this_00 = uVar10 & 0xfc000000 | uVar10 - 1 & 0x3ffffff;
        if ((-1 < iVar4) && (this->m_dirty == false)) {
          elem_index.m_val = (this_00->index).m_val;
          *(undefined8 *)(psVar9 + -2) = 0x25f6ca;
          update(this,iVar4,elem_index);
        }
      }
      goto LAB_0025f790;
    }
    peer_00._M_head_impl =
         *(uint **)&(bitmask->super_bitfield).m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  }
  puVar12 = (uint32_t *)((long)peer_00._M_head_impl + 4);
  if (peer_00._M_head_impl == (uint *)0x0) {
    puVar12 = (uint32_t *)0x0;
  }
  *(undefined8 *)(psVar9 + -2) = 0x25f6ed;
  cVar15 = bitfield::end(&bitmask->super_bitfield);
  uVar8 = cVar15._8_8_;
  lVar14 = 0;
  uVar10 = 0x80000000;
  bVar3 = 0;
  decremented_destructor.objects.m_len._4_4_ = cVar15.bit;
  while (uVar10 != (uint)uVar8 || puVar12 != cVar15.buf) {
    if ((*puVar12 &
        (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)) != 0)
    {
      ppVar1 = (this->m_piece_map).
               super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               .
               super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(uint *)((long)&ppVar1->field_0x0 + lVar14);
      if ((uVar5 & 0x3ffffff) == 0) {
        *(undefined8 *)(psVar9 + -2) = 0x25f739;
        break_one_seed(this);
        uVar8 = (ulong)decremented_destructor.objects.m_len._4_4_;
        uVar5 = *(uint *)((long)&ppVar1->field_0x0 + lVar14);
      }
      *(uint *)((long)&ppVar1->field_0x0 + lVar14) = uVar5 & 0xfc000000 | uVar5 - 1 & 0x3ffffff;
      bVar3 = 1;
    }
    bVar2 = uVar10 == 1;
    puVar12 = puVar12 + bVar2;
    uVar10 = uVar10 >> 1;
    if (bVar2) {
      uVar10 = 0x80000000;
    }
    lVar14 = lVar14 + 8;
  }
  if (((~bVar3 | this->m_dirty) & 1) == 0) {
    this->m_dirty = true;
  }
LAB_0025f790:
  *(undefined8 *)(psVar9 + -2) = 0x25f799;
  alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  ~alloca_destructor((alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                      *)local_50);
  return;
}

Assistant:

void piece_picker::dec_refcount(typed_bitfield<piece_index_t> const& bitmask
		, const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif
		TORRENT_ASSERT(bitmask.size() <= int(m_piece_map.size()));

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "dec_refcount(bitfield)" << std::endl;
#endif

		// nothing set, nothing to do here
		if (bitmask.none_set()) return;

		if (bitmask.all_set() && bitmask.size() == int(m_piece_map.size()))
		{
			dec_refcount_all(peer);
			return;
		}

		int const size = std::min(50, int(bitmask.size() / 2));

		// this is an optimization where if just a few
		// pieces end up changing, instead of making
		// the piece list dirty, just update those pieces
		// instead
		TORRENT_ALLOCA(decremented, piece_index_t, size);

		if (!m_dirty)
		{
			// first count how many pieces we're updating. If it's few (less than half)
			// we'll just update them one at a time. Otherwise we'll just update the counters
			// and mark the picker as dirty, so we'll rebuild it next time we need it.
			// this only matters if we're not already dirty, in which case the fasted
			// thing to do is to just update the counters and be done
			piece_index_t index{0};
			int num_dec = 0;
			for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
			{
				if (!*i) continue;
				if (num_dec < size) decremented[num_dec] = index;
				++num_dec;
				if (num_dec >= size) break;
			}

			if (num_dec < size)
			{
				// not that many pieces were updated
				// just update those individually instead of
				// rebuilding the whole piece list
				for (int i = 0; i < num_dec; ++i)
				{
					piece_index_t const piece = decremented[i];
					piece_pos& p = m_piece_map[piece];
					int prev_priority = p.priority(this);

					if (p.peer_count == 0)
					{
						TORRENT_ASSERT(m_seeds > 0);
						// this is the case where we have one or more
						// seeds, and one of them saying: I don't have this
						// piece anymore. we need to break up one of the seed
						// counters into actual peer counters on the pieces
						break_one_seed();
					}

#ifdef TORRENT_DEBUG_REFCOUNTS
					TORRENT_ASSERT(p.have_peers.count(peer) == 1);
					p.have_peers.erase(peer);
#else
					TORRENT_UNUSED(peer);
#endif
					TORRENT_ASSERT(p.peer_count > 0);
					--p.peer_count;
					if (!m_dirty && prev_priority >= 0) update(prev_priority, p.index);
				}
				return;
			}
		}

		piece_index_t index{0};
		bool updated = false;
		for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
		{
			if (*i)
			{
				piece_pos& p = m_piece_map[index];
				if (p.peer_count == 0)
				{
					TORRENT_ASSERT(m_seeds > 0);
					// this is the case where we have one or more
					// seeds, and one of them saying: I don't have this
					// piece anymore. we need to break up one of the seed
					// counters into actual peer counters on the pieces
					break_one_seed();
				}

#ifdef TORRENT_DEBUG_REFCOUNTS
				TORRENT_ASSERT(p.have_peers.count(peer) == 1);
				p.have_peers.erase(peer);
#else
				TORRENT_UNUSED(peer);
#endif

				TORRENT_ASSERT(p.peer_count > 0);
				--p.peer_count;
				updated = true;
			}
		}

		// if we're already dirty, no point in doing anything more
		if (m_dirty) return;

		if (updated) m_dirty = true;
	}